

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[24],wabt::(anonymous_namespace)::TagSymbol,char_const(&)[10],wabt::Type,char_const(&)[5],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [24],TagSymbol *u,char (*args) [10],Type *args_1,
          char (*args_2) [5],StackVar *args_3,char (*args_4) [3],Newline *args_5)

{
  Type type;
  Newline *u_00;
  
  anon_unknown_0::CWriter::WriteData((CWriter *)this,"wasm_rt_load_exception(",0x17);
  anon_unknown_0::CWriter::Write((CWriter *)this,(TagSymbol *)t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,", sizeof(",9);
  type.enum_ = (u->super_GlobalName).type;
  type.type_index_ = *(Index *)&(u->super_GlobalName).field_0x4;
  anon_unknown_0::CWriter::Write((CWriter *)this,type);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,"), &",4);
  anon_unknown_0::CWriter::Write((CWriter *)this,(StackVar *)args);
  Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>(this,(char (*) [3])0x172a57,u_00);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }